

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O0

ColumnDefinition * __thiscall duckdb::ColumnList::GetColumn(ColumnList *this,LogicalIndex logical)

{
  size_type sVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  ulong in_RSI;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *in_RDI;
  size_type in_stack_ffffffffffffff98;
  vector<duckdb::ColumnDefinition,_true> *in_stack_ffffffffffffffa0;
  allocator *paVar4;
  allocator local_31;
  unsigned_long in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  InternalException *in_stack_ffffffffffffffe0;
  
  sVar1 = ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::size
                    (in_RDI);
  if (sVar1 <= in_RSI) {
    uVar2 = __cxa_allocate_exception(0x10);
    paVar4 = &local_31;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&stack0xffffffffffffffd0,"Logical column index %lld out of range",paVar4);
    InternalException::InternalException<unsigned_long>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    __cxa_throw(uVar2,&InternalException::typeinfo,InternalException::~InternalException);
  }
  pvVar3 = vector<duckdb::ColumnDefinition,_true>::operator[]
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return pvVar3;
}

Assistant:

const ColumnDefinition &ColumnList::GetColumn(LogicalIndex logical) const {
	if (logical.index >= columns.size()) {
		throw InternalException("Logical column index %lld out of range", logical.index);
	}
	return columns[logical.index];
}